

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

shared_ptr<kratos::SwitchStmt> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::SwitchStmt> *stmt)

{
  size_t *this_00;
  _Base_ptr this_01;
  _Atomic_word _Var1;
  _Atomic_word _Var2;
  _Rb_tree_node_base *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Rb_tree_node_base *p_Var4;
  shared_ptr<kratos::SwitchStmt> sVar5;
  undefined1 local_a0 [8];
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  new_body;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _func_int **local_60;
  shared_ptr<kratos::StmtBlock> r;
  
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&new_body;
  new_body._M_t._M_impl._0_4_ = 0;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var3 = (_Rb_tree_node_base *)in_RDX->_vptr__Sp_counted_base[0x1f];
  p_Var4 = (_Rb_tree_node_base *)(in_RDX->_vptr__Sp_counted_base + 0x1d);
  new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX;
  if (p_Var3 != p_Var4) {
    this_00 = &new_body._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      this_01 = p_Var3[1]._M_right;
      if (this_01 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        }
      }
      process((RemoveEmptyBlockVisitor *)&local_60,(shared_ptr<kratos::StmtBlock> *)stmt);
      if (this_01 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if (local_60 != (_func_int **)0x0) {
        Stmt::as<kratos::ScopedStmtBlock>((Stmt *)this_00);
        std::
        _Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
        ::
        _M_emplace_unique<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::ScopedStmtBlock>>
                  ((_Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
                    *)local_a0,(shared_ptr<kratos::Const> *)(p_Var3 + 1),
                   (shared_ptr<kratos::ScopedStmtBlock> *)this_00);
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
      }
      if (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var4);
  }
  if (new_body._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)0x0;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
  }
  else {
    std::
    _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
    ::operator=((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)((r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi)->_vptr__Sp_counted_base + 0x1c),
                (_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                 *)local_a0);
    (this->super_IRVisitor)._vptr_IRVisitor =
         (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
         _vptr__Sp_counted_base;
    *(undefined8 *)&(this->super_IRVisitor).level = 0;
    _Var1 = (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count;
    _Var2 = (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_weak_count;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 0;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 0;
    (this->super_IRVisitor).level = _Var1;
    *(_Atomic_word *)&(this->super_IRVisitor).field_0xc = _Var2;
    (r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)0x0;
  }
  std::
  _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
               *)local_a0);
  sVar5.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::SwitchStmt>)
         sVar5.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SwitchStmt> process(std::shared_ptr<SwitchStmt> stmt) {
        std::map<std::shared_ptr<Const>, std::shared_ptr<ScopedStmtBlock>> new_body;
        auto const& body = stmt->body();
        for (const auto& [cond, block] : body) {
            auto r = process(block);
            if (r) {
                new_body.emplace(cond, r->as<ScopedStmtBlock>());
            }
        }
        if (new_body.empty()) return nullptr;
        stmt->set_body(new_body);
        return stmt;
    }